

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

int sat_solver_get_var_value(sat_solver *s,int v)

{
  char cVar1;
  int iVar2;
  
  cVar1 = s->assigns[v];
  if (cVar1 == '\0') {
    return 1;
  }
  iVar2 = -1;
  if (cVar1 != '\x01') {
    if (cVar1 != '\x03') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x7d,"int sat_solver_get_var_value(sat_solver *, int)");
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int sat_solver_get_var_value(sat_solver* s, int v)
{
    if ( var_value(s, v) == var0 )
        return l_False;
    if ( var_value(s, v) == var1 )
        return l_True;
    if ( var_value(s, v) == varX )
        return l_Undef;
    assert( 0 );
    return 0;
}